

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

bool llvm::consumeSignedInteger(StringRef *Str,uint Radix,longlong *Result)

{
  bool bVar1;
  char cVar2;
  undefined1 local_40 [8];
  StringRef Str2;
  unsigned_long_long ULLVal;
  longlong *Result_local;
  uint Radix_local;
  StringRef *Str_local;
  
  bVar1 = StringRef::empty(Str);
  if ((bVar1) || (cVar2 = StringRef::front(Str), cVar2 != '-')) {
    bVar1 = consumeUnsignedInteger(Str,Radix,&Str2.Length);
    if ((bVar1) || ((long)Str2.Length < 0)) {
      Str_local._7_1_ = true;
    }
    else {
      *Result = Str2.Length;
      Str_local._7_1_ = false;
    }
    return Str_local._7_1_;
  }
  _local_40 = StringRef::drop_front(Str,1);
  bVar1 = consumeUnsignedInteger((StringRef *)local_40,Radix,&Str2.Length);
  if ((!bVar1) && (-1 < (long)Str2.Length)) {
    Str->Data = (char *)local_40;
    Str->Length = (size_t)Str2.Data;
    *Result = -Str2.Length;
    return false;
  }
  return true;
}

Assistant:

bool llvm::consumeSignedInteger(StringRef &Str, unsigned Radix,
                                long long &Result) {
  unsigned long long ULLVal;

  // Handle positive strings first.
  if (Str.empty() || Str.front() != '-') {
    if (consumeUnsignedInteger(Str, Radix, ULLVal) ||
        // Check for value so large it overflows a signed value.
        (long long)ULLVal < 0)
      return true;
    Result = ULLVal;
    return false;
  }

  // Get the positive part of the value.
  StringRef Str2 = Str.drop_front(1);
  if (consumeUnsignedInteger(Str2, Radix, ULLVal) ||
      // Reject values so large they'd overflow as negative signed, but allow
      // "-0".  This negates the unsigned so that the negative isn't undefined
      // on signed overflow.
      (long long)-ULLVal > 0)
    return true;

  Str = Str2;
  Result = -ULLVal;
  return false;
}